

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O0

void __thiscall
foxxll::block_manager::
new_blocks<foxxll::random_cyclic,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
          (block_manager *this,random_cyclic *functor,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_begin,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_end,size_t alloc_offset)

{
  size_type __n;
  disk_block_allocator *pdVar1;
  value_type_conflict vVar2;
  size_t sVar3;
  bool bVar4;
  reference ppdVar5;
  reference pvVar6;
  pointer pBVar7;
  reference pvVar8;
  reference pvVar9;
  reference pBVar10;
  reference pvVar11;
  reference this_00;
  file *pfVar12;
  unsigned_long *puVar13;
  ulong local_100;
  size_t i_2;
  size_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *bid_perm;
  size_t d;
  simple_vector<BIDType> bids;
  size_t try_disk_id;
  size_t adv;
  size_t disk_id;
  size_t i;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  bid;
  size_t bid_size;
  value_type_conflict local_98;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_89;
  undefined1 local_88 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  disk_out;
  simple_vector<uint64_t> disk_bytes;
  undefined1 local_50 [8];
  simple_vector<size_t> disk_blocks;
  unique_lock<std::mutex> lock;
  size_t alloc_offset_local;
  random_cyclic *functor_local;
  block_manager *this_local;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  bid_end_local;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  bid_begin_local;
  
  this_local = (block_manager *)bid_end._M_current;
  bid_end_local = bid_begin;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&disk_blocks.array_,&this->mutex_);
  tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::SimpleVector
            ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50,&this->ndisks_);
  tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::SimpleVector
            ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)
             &disk_out.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->ndisks_);
  __n = this->ndisks_;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(&local_89);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_88,__n,&local_89);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator(&local_89)
  ;
  local_98 = 0;
  tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::fill
            ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50,&local_98);
  bid_size = 0;
  tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::fill
            ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)
             &disk_out.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&bid_size);
  bid._M_current =
       (BID<0UL> *)
       __gnu_cxx::operator-
                 ((__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                   *)&this_local,&bid_end_local);
  i = (size_t)bid_end_local._M_current;
  disk_id = 0;
  do {
    if (bid._M_current <= disk_id) {
      tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::SimpleVector
                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d);
      for (bid_perm = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
          bid_perm < (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->ndisks_;
          bid_perm = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&(bid_perm->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1)) {
        pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                           ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50,
                            (size_type)bid_perm);
        if (*pvVar6 != 0) {
          pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                             ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50,
                              (size_type)bid_perm);
          tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize
                    ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d,*pvVar6);
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_88,(size_type)bid_perm);
          for (i_2 = 0; pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::
                                 operator[]((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *
                                            )local_50,(size_type)bid_perm), i_2 < *pvVar6;
              i_2 = i_2 + 1) {
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pvVar8,i_2);
            pBVar10 = __gnu_cxx::
                      __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                      ::operator[](&bid_end_local,*pvVar9);
            pvVar11 = tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::operator[]
                                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d,i_2)
            ;
            pvVar11->storage = pBVar10->storage;
            pvVar11->offset = pBVar10->offset;
            pvVar11->size = pBVar10->size;
          }
          ppdVar5 = tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::
                    operator[](&this->block_allocators_,(size_type)bid_perm);
          disk_block_allocator::new_blocks<0ul>(*ppdVar5,(BIDArray<0UL> *)&d);
          for (local_100 = 0;
              pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                                 ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50,
                                  (size_type)bid_perm), local_100 < *pvVar6;
              local_100 = local_100 + 1) {
            this_00 = tlx::
                      SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
                      ::operator[](&this->disk_files_,(size_type)bid_perm);
            pfVar12 = tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::get(this_00);
            pvVar11 = tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::operator[]
                                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d,
                                 local_100);
            pvVar11->storage = pfVar12;
            pvVar11 = tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::operator[]
                                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d,
                                 local_100);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pvVar8,local_100);
            pBVar10 = __gnu_cxx::
                      __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                      ::operator[](&bid_end_local,*pvVar9);
            pBVar10->storage = pvVar11->storage;
            pBVar10->offset = pvVar11->offset;
            pBVar10->size = pvVar11->size;
            pvVar11 = tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::operator[]
                                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d,
                                 local_100);
            this->total_allocation_ = pvVar11->size + this->total_allocation_;
            pvVar11 = tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::operator[]
                                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d,
                                 local_100);
            this->current_allocation_ = pvVar11->size + this->current_allocation_;
          }
        }
      }
      puVar13 = std::max<unsigned_long>(&this->maximum_allocation_,&this->current_allocation_);
      this->maximum_allocation_ = *puVar13;
      tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::~SimpleVector
                ((SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> *)&d);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)local_88);
      tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::~SimpleVector
                ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)
                 &disk_out.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::~SimpleVector
                ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&disk_blocks.array_);
      return;
    }
    adv = random_cyclic::operator()(functor,alloc_offset + disk_id);
    ppdVar5 = tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::
              operator[](&this->block_allocators_,adv);
    pdVar1 = *ppdVar5;
    pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                       ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)
                        &disk_out.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,adv);
    vVar2 = *pvVar6;
    pBVar7 = __gnu_cxx::
             __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
             ::operator->((__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                           *)&i);
    bVar4 = disk_block_allocator::has_available_space(pdVar1,vVar2 + pBVar7->size);
    if (!bVar4) {
      for (try_disk_id = 1; try_disk_id < this->ndisks_; try_disk_id = try_disk_id + 1) {
        bids.array_ = (value_type *)((adv + try_disk_id) % this->ndisks_);
        ppdVar5 = tlx::SimpleVector<foxxll::disk_block_allocator_*,_(tlx::SimpleVectorMode)0>::
                  operator[](&this->block_allocators_,(size_type)bids.array_);
        pdVar1 = *ppdVar5;
        pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                           ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)
                            &disk_out.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (size_type)bids.array_);
        vVar2 = *pvVar6;
        pBVar7 = __gnu_cxx::
                 __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                 ::operator->((__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                               *)&i);
        bVar4 = disk_block_allocator::has_available_space(pdVar1,vVar2 + pBVar7->size);
        if (bVar4) {
          adv = (size_t)bids.array_;
          break;
        }
      }
    }
    pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                       ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)local_50,adv);
    *pvVar6 = *pvVar6 + 1;
    pBVar7 = __gnu_cxx::
             __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
             ::operator->((__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                           *)&i);
    sVar3 = pBVar7->size;
    pvVar6 = tlx::SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0>::operator[]
                       ((SimpleVector<unsigned_long,_(tlx::SimpleVectorMode)0> *)
                        &disk_out.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,adv);
    *pvVar6 = *pvVar6 + sVar3;
    pvVar8 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_88,adv);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar8,&disk_id);
    disk_id = disk_id + 1;
    __gnu_cxx::
    __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
    ::operator++((__normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
                  *)&i);
  } while( true );
}

Assistant:

void block_manager::new_blocks(
    const DiskAssignFunctor& functor,
    BIDIterator bid_begin, BIDIterator bid_end,
    size_t alloc_offset)
{
    std::unique_lock<std::mutex> lock(mutex_);

    using BIDType = typename std::iterator_traits<BIDIterator>::value_type;

    // choose disks for each block, sum up bytes allocated on a disk

    tlx::simple_vector<size_t> disk_blocks(ndisks_);
    tlx::simple_vector<uint64_t> disk_bytes(ndisks_);
    std::vector<std::vector<size_t> > disk_out(ndisks_);

    disk_blocks.fill(0);
    disk_bytes.fill(0);

    size_t bid_size = static_cast<size_t>(bid_end - bid_begin);

    BIDIterator bid = bid_begin;
    for (size_t i = 0; i < bid_size; ++i, ++bid)
    {
        size_t disk_id = functor(alloc_offset + i);

        if (!block_allocators_[disk_id]->has_available_space(
                disk_bytes[disk_id] + bid->size
            ))
        {
            // find disk (cyclically) that has enough free space for block

            for (size_t adv = 1; adv < ndisks_; ++adv)
            {
                size_t try_disk_id = (disk_id + adv) % ndisks_;
                if (block_allocators_[try_disk_id]->has_available_space(
                        disk_bytes[try_disk_id] + bid->size
                    ))
                {
                    disk_id = try_disk_id;
                    break;
                }
            }

            // if no disk has free space, pick first selected by functor
        }

        // assign block to disk
        disk_blocks[disk_id]++;
        disk_bytes[disk_id] += bid->size;
        disk_out[disk_id].push_back(i);
    }

    // allocate blocks on disks in sequence, then scatter blocks into output

    tlx::simple_vector<BIDType> bids;

    for (size_t d = 0; d < ndisks_; ++d)
    {
        if (disk_blocks[d] == 0) continue;
        bids.resize(disk_blocks[d]);

        std::vector<size_t>& bid_perm = disk_out[d];

        // collect bids from output (due to size field for BID<0>)
        for (size_t i = 0; i < disk_blocks[d]; ++i)
            bids[i] = bid_begin[bid_perm[i]];

        // let block_allocator fill in offset fields
        block_allocators_[d]->new_blocks(bids);

        // distributed bids back to output
        for (size_t i = 0; i < disk_blocks[d]; ++i) {
            bids[i].storage = disk_files_[d].get();

            TLX_LOGC(verbose_block_life_cycle) << "BLC:new    " << bids[i];
            bid_begin[bid_perm[i]] = bids[i];

            total_allocation_ += bids[i].size;
            current_allocation_ += bids[i].size;
        }
    }

    maximum_allocation_ = std::max(maximum_allocation_, current_allocation_);
}